

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

void cmsys::SystemTools::GetPath
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *path,char *env)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  pointer path_00;
  string pathEnv;
  long *local_70;
  long local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = "PATH";
  if (env != (char *)0x0) {
    pcVar1 = env;
  }
  pcVar1 = getenv(pcVar1);
  if (pcVar1 != (char *)0x0) {
    local_70 = local_60;
    sVar2 = strlen(pcVar1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar1,pcVar1 + sVar2);
    if ((local_68 != 0) && (*(char *)((long)local_70 + local_68 + -1) != ':')) {
      std::__cxx11::string::push_back((char)&local_70);
    }
    bVar4 = false;
    do {
      lVar3 = std::__cxx11::string::find((char)&local_70,0x3a);
      if (lVar3 == -1) {
        bVar4 = true;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)path,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    } while (!bVar4);
    for (path_00 = (path->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        path_00 !=
        (path->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish; path_00 = path_00 + 1) {
      ConvertToUnixSlashes(path_00);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  return;
}

Assistant:

void SystemTools::GetPath(kwsys_stl::vector<kwsys_stl::string>& path, const char* env)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const char pathSep = ';';
#else
  const char pathSep = ':';
#endif
  if(!env)
    {
    env = "PATH";
    }
  const char* cpathEnv = SystemTools::GetEnv(env);
  if ( !cpathEnv )
    {
    return;
    }

  kwsys_stl::string pathEnv = cpathEnv;

  // A hack to make the below algorithm work.
  if(!pathEnv.empty() && *pathEnv.rbegin() != pathSep)
    {
    pathEnv += pathSep;
    }
  kwsys_stl::string::size_type start =0;
  bool done = false;
  while(!done)
    {
    kwsys_stl::string::size_type endpos = pathEnv.find(pathSep, start);
    if(endpos != kwsys_stl::string::npos)
      {
      path.push_back(pathEnv.substr(start, endpos-start));
      start = endpos+1;
      }
    else
      {
      done = true;
      }
    }
  for(kwsys_stl::vector<kwsys_stl::string>::iterator i = path.begin();
      i != path.end(); ++i)
    {
    SystemTools::ConvertToUnixSlashes(*i);
    }
}